

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump_node_edges(DG2Dot<dg::LLVMNode> *this,LLVMNode *n,int ind)

{
  bool bVar1;
  ostream *poVar2;
  Value *pVVar3;
  reference ppLVar4;
  int in_EDX;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_RSI;
  long in_RDI;
  interference_iterator EE_7;
  interference_iterator II_7;
  interference_iterator EE_6;
  interference_iterator II_6;
  control_iterator EE_5;
  control_iterator II_5;
  control_iterator EE_4;
  control_iterator II_4;
  use_iterator EE_3;
  use_iterator II_3;
  use_iterator EE_2;
  use_iterator II_2;
  data_iterator EE_1;
  data_iterator II_1;
  data_iterator EE;
  data_iterator II;
  Indent Ind;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_stack_ffffffffffffff18;
  ostream *in_stack_ffffffffffffff20;
  _Self local_98;
  _Self local_90;
  _Self local_88;
  _Self local_80;
  _Self local_78;
  _Self local_70;
  _Self local_68;
  _Self local_60;
  _Self local_58;
  _Self local_50;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  Indent local_18 [2];
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *local_10;
  
  local_10 = in_RSI;
  Indent::Indent(local_18,in_EDX);
  poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
  poVar2 = std::operator<<(poVar2,"/* -- node ");
  pVVar3 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getKey(local_10);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pVVar3);
  std::operator<<(poVar2,"\n");
  poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
  std::operator<<(poVar2," * ------------------------------------------- */\n");
  if ((*(uint *)(in_RDI + 0x68) & 4) != 0) {
    poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
    std::operator<<(poVar2,"/* DD edges */\n");
    local_20._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::data_begin
                   (in_stack_ffffffffffffff18);
    local_28._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::data_end
                   (in_stack_ffffffffffffff18);
    while (bVar1 = std::operator!=(&local_20,&local_28), bVar1) {
      poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
      poVar2 = std::operator<<(poVar2,"NODE");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
      poVar2 = std::operator<<(poVar2," -> NODE");
      ppLVar4 = std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                          ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1bb351);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*ppLVar4);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,*(char **)(in_RDI + 0x70));
      std::operator<<(poVar2,"\" rank=max]\n");
      std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++
                ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)in_stack_ffffffffffffff20);
    }
  }
  if ((*(uint *)(in_RDI + 0x68) & 8) != 0) {
    poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
    std::operator<<(poVar2,"/* reverse DD edges */\n");
    local_30._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::rev_data_begin
                   (in_stack_ffffffffffffff18);
    local_38._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::rev_data_end
                   (in_stack_ffffffffffffff18);
    while (bVar1 = std::operator!=(&local_30,&local_38), bVar1) {
      poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
      poVar2 = std::operator<<(poVar2,"NODE");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
      poVar2 = std::operator<<(poVar2," -> NODE");
      ppLVar4 = std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                          ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1bb47e);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*ppLVar4);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,*(char **)(in_RDI + 0x70));
      std::operator<<(poVar2,"\" style=\"dashed\"  constraint=false]\n");
      std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++
                ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)in_stack_ffffffffffffff20);
    }
  }
  if ((*(uint *)(in_RDI + 0x68) & 0x10) != 0) {
    poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
    std::operator<<(poVar2,"/* USE edges */\n");
    local_40._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::use_begin
                   (in_stack_ffffffffffffff18);
    local_48._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::use_end
                   (in_stack_ffffffffffffff18);
    while (bVar1 = std::operator!=(&local_40,&local_48), bVar1) {
      poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
      poVar2 = std::operator<<(poVar2,"NODE");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
      poVar2 = std::operator<<(poVar2," -> NODE");
      ppLVar4 = std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                          ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1bb5ab);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*ppLVar4);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,*(char **)(in_RDI + 0x78));
      std::operator<<(poVar2,"\" rank=max style=\"dashed\"]\n");
      std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++
                ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)in_stack_ffffffffffffff20);
    }
  }
  if ((*(uint *)(in_RDI + 0x68) & 0x20) != 0) {
    poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
    std::operator<<(poVar2,"/* user edges */\n");
    local_50._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::user_begin
                   (in_stack_ffffffffffffff18);
    local_58._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::user_end
                   (in_stack_ffffffffffffff18);
    while (bVar1 = std::operator!=(&local_50,&local_58), bVar1) {
      poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
      poVar2 = std::operator<<(poVar2,"NODE");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
      poVar2 = std::operator<<(poVar2," -> NODE");
      ppLVar4 = std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                          ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1bb6d8);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*ppLVar4);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,*(char **)(in_RDI + 0x78));
      std::operator<<(poVar2,"\" style=\"dashed\"  constraint=false]\n");
      std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++
                ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)in_stack_ffffffffffffff20);
    }
  }
  if ((*(uint *)(in_RDI + 0x68) & 0x40) != 0) {
    poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
    std::operator<<(poVar2,"/* CD edges */\n");
    local_60._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::control_begin
                   (in_stack_ffffffffffffff18);
    local_68._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::control_end
                   (in_stack_ffffffffffffff18);
    while (bVar1 = std::operator!=(&local_60,&local_68), bVar1) {
      poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
      poVar2 = std::operator<<(poVar2,"NODE");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
      poVar2 = std::operator<<(poVar2," -> NODE");
      ppLVar4 = std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                          ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1bb805);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*ppLVar4);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,*(char **)(in_RDI + 0x80));
      std::operator<<(poVar2,"\"]\n");
      std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++
                ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)in_stack_ffffffffffffff20);
    }
  }
  if ((*(uint *)(in_RDI + 0x68) & 0x80) != 0) {
    poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
    std::operator<<(poVar2,"/* reverse CD edges */\n");
    local_70._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::rev_control_begin
                   (in_stack_ffffffffffffff18);
    local_78._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::rev_control_end
                   (in_stack_ffffffffffffff18);
    while (bVar1 = std::operator!=(&local_70,&local_78), bVar1) {
      poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
      poVar2 = std::operator<<(poVar2,"NODE");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
      poVar2 = std::operator<<(poVar2," -> NODE");
      ppLVar4 = std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                          ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1bb928);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*ppLVar4);
      poVar2 = std::operator<<(poVar2," [color=\"");
      poVar2 = std::operator<<(poVar2,*(char **)(in_RDI + 0x80));
      std::operator<<(poVar2,"\" style=\"dashed\" constraint=false]\n");
      std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++
                ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)in_stack_ffffffffffffff20);
    }
  }
  if ((*(uint *)(in_RDI + 0x68) & 0x100) != 0) {
    poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
    std::operator<<(poVar2,"/* ID edges */\n");
    local_80._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::interference_begin
                   (in_stack_ffffffffffffff18);
    local_88._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::interference_end
                   (in_stack_ffffffffffffff18);
    while (bVar1 = std::operator!=(&local_80,&local_88), bVar1) {
      poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
      poVar2 = std::operator<<(poVar2,"NODE");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
      in_stack_ffffffffffffff20 = std::operator<<(poVar2," -> NODE");
      ppLVar4 = std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                          ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1bba48);
      poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff20,*ppLVar4);
      std::operator<<(poVar2," [color=\"red\" constraint=false]\n");
      std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++
                ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)in_stack_ffffffffffffff20);
    }
  }
  if ((*(uint *)(in_RDI + 0x68) & 0x200) != 0) {
    poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
    std::operator<<(poVar2,"/* reverse ID edges */\n");
    local_90._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::rev_interference_begin
                   (in_stack_ffffffffffffff18);
    local_98._M_node =
         (_Base_ptr)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::rev_interference_end
                   (in_stack_ffffffffffffff18);
    while (bVar1 = std::operator!=(&local_90,&local_98), bVar1) {
      poVar2 = operator<<(in_stack_ffffffffffffff20,(Indent *)in_stack_ffffffffffffff18);
      poVar2 = std::operator<<(poVar2,"NODE");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
      in_stack_ffffffffffffff18 =
           (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)
           std::operator<<(poVar2," -> NODE");
      ppLVar4 = std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                          ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1bbb41);
      poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff18,*ppLVar4);
      std::operator<<(poVar2," [color=\"orange\" constraint=false]\n");
      std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++
                ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)in_stack_ffffffffffffff20);
    }
  }
  return;
}

Assistant:

void dump_node_edges(NodeT *n, int ind = 1) {
        Indent Ind(ind);

        out << Ind << "/* -- node " << n->getKey() << "\n"
            << Ind << " * ------------------------------------------- */\n";

        if (options & PRINT_DD) {
            out << Ind << "/* DD edges */\n";
            for (auto II = n->data_begin(), EE = n->data_end(); II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << dd_color << "\" rank=max]\n";
        }

        if (options & PRINT_REV_DD) {
            out << Ind << "/* reverse DD edges */\n";
            for (auto II = n->rev_data_begin(), EE = n->rev_data_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << dd_color << "\" style=\"dashed\"  constraint=false]\n";
        }

        if (options & PRINT_USE) {
            out << Ind << "/* USE edges */\n";
            for (auto II = n->use_begin(), EE = n->use_end(); II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << use_color << "\" rank=max style=\"dashed\"]\n";
        }

        if (options & PRINT_USER) {
            out << Ind << "/* user edges */\n";
            for (auto II = n->user_begin(), EE = n->user_end(); II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << use_color << "\" style=\"dashed\"  constraint=false]\n";
        }

        if (options & PRINT_CD) {
            out << Ind << "/* CD edges */\n";
            for (auto II = n->control_begin(), EE = n->control_end(); II != EE;
                 ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << cd_color << "\"]\n";
        }

        if (options & PRINT_REV_CD) {
            out << Ind << "/* reverse CD edges */\n";
            for (auto II = n->rev_control_begin(), EE = n->rev_control_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II << " [color=\""
                    << cd_color << "\" style=\"dashed\" constraint=false]\n";
        }

        if (options & PRINT_ID) {
            out << Ind << "/* ID edges */\n";
            for (auto II = n->interference_begin(), EE = n->interference_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II
                    << " [color=\"red\" constraint=false]\n";
        }

        if (options & PRINT_REV_ID) {
            out << Ind << "/* reverse ID edges */\n";
            for (auto II = n->rev_interference_begin(),
                      EE = n->rev_interference_end();
                 II != EE; ++II)
                out << Ind << "NODE" << n << " -> NODE" << *II
                    << " [color=\"orange\" constraint=false]\n";
        }
    }